

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::sort_subarrays(Suffix_Array<unsigned_long> *this)

{
  ostream *poVar1;
  nanoseconds *in_RDI;
  rep_conflict rVar2;
  time_point t_e;
  anon_class_24_3_47ecaece sort_subarr;
  atomic_uint64_t solved_;
  idx_t_conflict subarr_size;
  time_point t_s;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 conservative;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb8;
  anon_class_24_3_47ecaece *in_stack_ffffffffffffffc0;
  undefined1 local_20 [8];
  ulong local_18;
  undefined8 local_10;
  
  conservative = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  local_10 = std::chrono::_V2::system_clock::now();
  local_18 = (ulong)in_RDI[1].__r / (ulong)in_RDI[6].__r;
  memset(local_20,0,8);
  parlay::
  parallel_for<CaPS_SA::Suffix_Array<unsigned_long>::sort_subarrays()::_lambda(unsigned_long)_1_const&>
            ((size_t)&local_18,(size_t)in_RDI,in_stack_ffffffffffffffc0,
             (long)in_stack_ffffffffffffffb8,(bool)conservative);
  std::operator<<((ostream *)&std::cerr,"\n");
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cerr,"Sorted the subarrays independently. Time taken: ")
  ;
  std::chrono::operator-
            (in_stack_ffffffffffffffb8,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)poVar1);
  rVar2 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)poVar1,in_RDI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::sort_subarrays()
{
    const auto t_s = now();

    const auto subarr_size = n_ / p_;   // Size of each subarray to be sorted independently.
    std::atomic_uint64_t solved_ = 0;   // Progress tracker—number of subproblems solved in some step.
    const auto sort_subarr =
        [&](const idx_t i)
        {
            merge_sort( SA_w + i * subarr_size, SA_ + i * subarr_size,
                        subarr_size + (i < p_ - 1 ? 0 : n_ % p_),
                        LCP_ + i * subarr_size, LCP_w + i * subarr_size);

            if(++solved_ % 8 == 0)
                std::cerr << "\rSorted " << solved_ << " subarrays.";
        };

    parlay::parallel_for(0, p_, sort_subarr, 1);
    std::cerr << "\n";

    const auto t_e = now();
    std::cerr << "Sorted the subarrays independently. Time taken: " << duration(t_e - t_s) << " seconds.\n";
}